

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O0

void __thiscall tf::Executor::_tear_down_topology(Executor *this,Worker *worker,Topology *tpg)

{
  bool bVar1;
  size_type __i;
  size_type sVar2;
  __shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *tpg_00;
  _List_iterator<tf::Taskflow> *__x;
  const_iterator local_a8;
  scoped_lock<std::mutex> local_a0;
  scoped_lock<std::mutex> lock_2;
  optional<std::_List_iterator<tf::Taskflow>_> s;
  type c;
  type p;
  unique_lock<std::mutex> lock_1;
  lock_guard<std::mutex> local_30;
  lock_guard<std::mutex> lock;
  Taskflow *f;
  Topology *tpg_local;
  Worker *worker_local;
  Executor *this_local;
  
  lock._M_device = (mutex_type *)tpg->_taskflow;
  bVar1 = std::atomic::operator_cast_to_bool((atomic *)tpg);
  if ((bVar1) || (bVar1 = std::function<bool_()>::operator()(&tpg->_pred), bVar1)) {
    bVar1 = std::operator==(&tpg->_call,(nullptr_t)0x0);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::function<void_()>::operator()(&tpg->_call);
    }
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)&p._M_storage,
               (mutex_type *)((long)&((lock._M_device)->super___mutex_base)._M_mutex + 8));
    sVar2 = std::
            queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
            ::size((queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
                    *)&lock._M_device[2].super___mutex_base._M_mutex.__data.__list);
    if (sVar2 < 2) {
      std::promise<void>::promise((promise<void> *)&c._M_invoker,&tpg->_promise);
      std::function<void_()>::function
                ((function<void_()> *)
                 &s.super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>._M_payload.
                  super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_engaged,
                 &tpg->_call);
      lock_2._M_device =
           (mutex_type *)lock._M_device[4].super___mutex_base._M_mutex.__data.__list.__prev;
      s.super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>._M_payload.
      super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_payload =
           (_Storage<std::_List_iterator<tf::Taskflow>,_true>)
           lock._M_device[4].super___mutex_base._M_mutex.__data.__list.__next;
      std::
      queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
      ::pop((queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
             *)&lock._M_device[2].super___mutex_base._M_mutex.__data.__list);
      std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&p._M_storage);
      std::promise<void>::set_value((promise<void> *)&c._M_invoker);
      _decrement_topology_and_notify(this);
      bVar1 = std::optional::operator_cast_to_bool((optional *)&lock_2);
      if (bVar1) {
        std::scoped_lock<std::mutex>::scoped_lock(&local_a0,&this->_taskflow_mutex);
        __x = std::optional<std::_List_iterator<tf::Taskflow>_>::operator*
                        ((optional<std::_List_iterator<tf::Taskflow>_> *)&lock_2);
        std::_List_const_iterator<tf::Taskflow>::_List_const_iterator(&local_a8,__x);
        std::__cxx11::list<tf::Taskflow,_std::allocator<tf::Taskflow>_>::erase
                  (&this->_taskflows,local_a8);
        std::scoped_lock<std::mutex>::~scoped_lock(&local_a0);
      }
      std::function<void_()>::~function
                ((function<void_()> *)
                 &s.super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>._M_payload.
                  super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_engaged);
      std::promise<void>::~promise((promise<void> *)&c._M_invoker);
    }
    else {
      std::promise<void>::set_value(&tpg->_promise);
      std::
      queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
      ::pop((queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
             *)&lock._M_device[2].super___mutex_base._M_mutex.__data.__list);
      this_00 = &std::
                 queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
                 ::front((queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
                          *)&lock._M_device[2].super___mutex_base._M_mutex.__data.__list)->
                 super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>;
      tpg_00 = std::__shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
      _decrement_topology(this);
      _set_up_topology(this,worker,tpg_00);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&p._M_storage);
  }
  else {
    std::lock_guard<std::mutex>::lock_guard
              (&local_30,(mutex_type *)((long)&((lock._M_device)->super___mutex_base)._M_mutex + 8))
    ;
    __i = SmallVectorTemplateCommon<tf::Node_*,_void>::size
                    ((SmallVectorTemplateCommon<tf::Node_*,_void> *)&tpg->_sources);
    std::__atomic_base<unsigned_long>::operator=
              (&(tpg->_join_counter).super___atomic_base<unsigned_long>,__i);
    _schedule(this,worker,&tpg->_sources);
    std::lock_guard<std::mutex>::~lock_guard(&local_30);
  }
  return;
}

Assistant:

inline void Executor::_tear_down_topology(Worker& worker, Topology* tpg) {

  auto &f = tpg->_taskflow;

  //assert(&tpg == &(f._topologies.front()));

  // case 1: we still need to run the topology again
  if(!tpg->_is_cancelled && !tpg->_pred()) {
    //assert(tpg->_join_counter == 0);
    std::lock_guard<std::mutex> lock(f._mutex);
    tpg->_join_counter = tpg->_sources.size();
    _schedule(worker, tpg->_sources);
  }
  // case 2: the final run of this topology
  else {

    // TODO: if the topology is cancelled, need to release all semaphores

    if(tpg->_call != nullptr) {
      tpg->_call();
    }

    // If there is another run (interleave between lock)
    if(std::unique_lock<std::mutex> lock(f._mutex); f._topologies.size()>1) {
      //assert(tpg->_join_counter == 0);

      // Set the promise
      tpg->_promise.set_value();
      f._topologies.pop();
      tpg = f._topologies.front().get();

      // decrement the topology but since this is not the last we don't notify
      _decrement_topology();

      // set up topology needs to be under the lock or it can
      // introduce memory order error with pop
      _set_up_topology(&worker, tpg);
    }
    else {
      //assert(f._topologies.size() == 1);

      // Need to back up the promise first here becuz taskflow might be
      // destroy soon after calling get
      auto p {std::move(tpg->_promise)};

      // Back up lambda capture in case it has the topology pointer,
      // to avoid it releasing on pop_front ahead of _mutex.unlock &
      // _promise.set_value. Released safely when leaving scope.
      auto c {std::move(tpg->_call)};

      // Get the satellite if any
      auto s {f._satellite};

      // Now we remove the topology from this taskflow
      f._topologies.pop();

      //f._mutex.unlock();
      lock.unlock();

      // We set the promise in the end in case taskflow leaves the scope.
      // After set_value, the caller will return from wait
      p.set_value();

      _decrement_topology_and_notify();

      // remove the taskflow if it is managed by the executor
      // TODO: in the future, we may need to synchronize on wait
      // (which means the following code should the moved before set_value)
      if(s) {
        std::scoped_lock<std::mutex> lock(_taskflow_mutex);
        _taskflows.erase(*s);
      }
    }
  }
}